

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  string *path;
  pointer this_00;
  cmake *this_local;
  
  if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xd])();
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Generate graphviz: ");
        poVar3 = std::operator<<(poVar3,(string *)&this->GraphVizFile);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        GenerateGraphViz(this,&this->GraphVizFile);
      }
      if ((this->WarnUnusedCli & 1U) != 0) {
        RunCheckForUnusedVariables(this);
      }
      bVar1 = cmSystemTools::GetErrorOccuredFlag();
      if (bVar1) {
        this_local._4_4_ = -1;
      }
      else {
        path = GetHomeOutputDirectory_abi_cxx11_(this);
        SaveCache(this,path);
        this_00 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->
                            (&this->FileAPI);
        cmFileAPI::WriteReplies(this_00);
        this_local._4_4_ = 0;
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile);
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  this->SaveCache(this->GetHomeOutputDirectory());

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->FileAPI->WriteReplies();
#endif

  return 0;
}